

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O1

void __thiscall QAbstractItemView::mousePressEvent(QAbstractItemView *this,QMouseEvent *event)

{
  QAbstractItemViewPrivate *this_00;
  Data *pDVar1;
  QWidget *this_01;
  undefined1 uVar2;
  bool bVar3;
  byte bVar4;
  char cVar5;
  undefined4 uVar6;
  uint uVar7;
  SelectionFlag SVar8;
  LayoutDirection LVar9;
  int iVar10;
  SelectionFlag SVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  QPoint QVar16;
  long lVar17;
  QModelIndex *pQVar18;
  QObject *pQVar19;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  undefined1 auVar20 [16];
  double extraout_XMM1_Qa;
  undefined1 auVar21 [16];
  QPersistentModelIndex index;
  QPoint pos;
  QModelIndex local_78;
  QPersistentModelIndex local_58;
  undefined8 local_50;
  undefined1 *local_48;
  QModelIndex *pQStack_40;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_38;
  
  local_38.ptr = *(QAbstractItemModel **)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemViewPrivate **)(this + 8);
  this_00->releaseFromDoubleClick = false;
  QBasicTimer::stop();
  local_50 = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  uVar6 = QEventPoint::position();
  auVar21._0_8_ =
       (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
       extraout_XMM1_Qa;
  auVar21._8_8_ =
       (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
       extraout_XMM0_Qa;
  auVar21 = minpd(_DAT_0066f5d0,auVar21);
  auVar20._8_8_ = -(ulong)(-2147483648.0 < auVar21._8_8_);
  auVar20._0_8_ = -(ulong)(-2147483648.0 < auVar21._0_8_);
  uVar7 = movmskpd(uVar6,auVar20);
  uVar14 = 0x8000000000000000;
  if ((uVar7 & 1) != 0) {
    uVar14 = (ulong)(uint)(int)auVar21._0_8_ << 0x20;
  }
  uVar13 = 0x80000000;
  if ((uVar7 & 2) != 0) {
    uVar13 = (ulong)(uint)(int)auVar21._8_8_;
  }
  local_50 = (QModelIndex *)(uVar13 | uVar14);
  local_58.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
  (**(code **)(*(long *)this + 0x1f0))(&local_78,this,&local_50);
  QPersistentModelIndex::QPersistentModelIndex(&local_58,&local_78);
  if ((this_00->pressClosedEditorWatcher).m_id == Invalid) {
    uVar2 = false;
  }
  else {
    uVar2 = comparesEqual(&this_00->lastEditedIndex,&local_58);
  }
  this_00->pressClosedEditor = (bool)uVar2;
  pDVar1 = (this_00->selectionModel).wp.d;
  if (((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
     ((this_00->selectionModel).wp.value != (QObject *)0x0)) {
    if (this_00->state == EditingState) {
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_78,&local_58);
      bVar3 = QAbstractItemViewPrivate::hasEditor(this_00,&local_78);
      if (bVar3) goto LAB_0053d102;
    }
    pDVar1 = (this_00->selectionModel).wp.d;
    if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
      pQVar18 = (QModelIndex *)0x0;
    }
    else {
      pQVar18 = (QModelIndex *)(this_00->selectionModel).wp.value;
    }
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_78,&local_58);
    bVar3 = (bool)QItemSelectionModel::isSelected(pQVar18);
    this_00->pressedAlreadySelected = bVar3;
    QPersistentModelIndex::operator=(&this_00->pressedIndex,&local_58);
    (this_00->pressedModifiers).super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
    super_QFlagsStorage<Qt::KeyboardModifier>.i = *(Int *)(event + 0x20);
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_78,&local_58);
    SVar8 = (**(code **)(*(long *)this + 0x2e8))(this,&local_78,event);
    if (SVar8 == NoUpdate) {
      bVar4 = true;
    }
    else {
      bVar4 = QPersistentModelIndex::isValid();
      bVar4 = bVar4 ^ 1;
    }
    this_00->noSelectionOnMousePress = (bool)bVar4;
    this_01 = *(QWidget **)
               &(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate
                .field_0x8;
    LVar9 = QWidget::layoutDirection(this_01);
    iVar10 = (**(code **)(*(long *)this_01 + 0x2b0))(this_01);
    iVar12 = -iVar10;
    if (LVar9 != RightToLeft) {
      iVar12 = iVar10;
    }
    iVar10 = (**(code **)(*(long *)this_01 + 0x2b8))(this_01);
    QVar16.xp.m_i = iVar12 + (int)local_50;
    QVar16.yp.m_i = iVar10 + local_50._4_4_;
    this_00->draggedPosition = QVar16;
    if (this_00->dragEnabled == true) {
      this_00->pressedPosition = QVar16;
    }
    if ((SVar8 & Current) == NoUpdate) {
      this_00->pressedPosition = QVar16;
      QPersistentModelIndex::operator=(&this_00->currentSelectionStartIndex,&local_58);
    }
    else {
      cVar5 = QPersistentModelIndex::isValid();
      if (cVar5 == '\0') {
        currentIndex(&local_78,this);
        QPersistentModelIndex::operator=(&this_00->currentSelectionStartIndex,&local_78);
      }
    }
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_78,&local_58);
    cVar5 = (**(code **)(*(long *)this + 0x2e0))(this,&local_78,0,event);
    if (cVar5 == '\0') {
      cVar5 = QPersistentModelIndex::isValid();
      if (cVar5 != '\0') {
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_78,&local_58);
        uVar14 = (**(code **)(*(long *)this_00->model + 0x138))(this_00->model,&local_78);
        if ((uVar14 & 0x20) != 0) {
          bVar3 = this_00->autoScroll;
          this_00->autoScroll = false;
          pDVar1 = (this_00->selectionModel).wp.d;
          if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
            pQVar19 = (QObject *)0x0;
          }
          else {
            pQVar19 = (this_00->selectionModel).wp.value;
          }
          QPersistentModelIndex::operator_cast_to_QModelIndex(&local_78,&local_58);
          (**(code **)(*(long *)pQVar19 + 0x60))(pQVar19,&local_78,0);
          this_00->autoScroll = bVar3;
          if ((SVar8 & Toggle) != NoUpdate) {
            pDVar1 = (this_00->selectionModel).wp.d;
            if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
              pQVar18 = (QModelIndex *)0x0;
            }
            else {
              pQVar18 = (QModelIndex *)(this_00->selectionModel).wp.value;
            }
            QPersistentModelIndex::operator_cast_to_QModelIndex(&local_78,&local_58);
            bVar4 = QItemSelectionModel::isSelected(pQVar18);
            SVar11 = (uint)bVar4 * 2 + Select;
            this_00->ctrlDragSelectionFlag = SVar11;
            SVar8 = SVar8 & ~Toggle | SVar11;
          }
          if ((SVar8 & Current) == NoUpdate) {
            pQVar18 = &local_78;
            local_78._0_8_ = local_50;
            local_78.i = (quintptr)local_50;
            lVar15 = *(long *)this;
          }
          else {
            pQVar18 = (QModelIndex *)&local_48;
            local_48 = &DAT_aaaaaaaaaaaaaaaa;
            pQStack_40 = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
            QPersistentModelIndex::operator_cast_to_QModelIndex
                      (&local_78,&this_00->currentSelectionStartIndex);
            auVar21 = (**(code **)(*(long *)this + 0x1e0))(this,&local_78);
            lVar17 = (long)auVar21._8_4_ + (long)auVar21._0_4_;
            lVar15 = (auVar21._8_8_ >> 0x20) + (auVar21._0_8_ >> 0x20);
            local_48 = (undefined1 *)
                       CONCAT44((int)((ulong)(lVar15 - (lVar15 >> 0x3f)) >> 1),
                                (int)((ulong)(lVar17 - (lVar17 >> 0x3f)) >> 1));
            pQStack_40 = local_50;
            lVar15 = *(long *)this;
          }
          (**(code **)(lVar15 + 0x2c8))(this,pQVar18,SVar8);
          QPersistentModelIndex::operator_cast_to_QModelIndex(&local_78,&local_58);
          local_48 = (undefined1 *)0x0;
          pQStack_40 = &local_78;
          QMetaObject::activate((QObject *)this,&staticMetaObject,0,&local_48);
          if (this_00->autoScroll == true) {
            iVar12 = QApplication::doubleClickInterval();
            QBasicTimer::start(&this_00->delayedAutoScroll,(long)(iVar12 + 100) * 1000000,1,this);
          }
          goto LAB_0053d102;
        }
      }
      pQVar19 = (this_00->selectionModel).wp.value;
      local_78._0_8_ = (QModelIndex *)0xffffffffffffffff;
      local_78.i = 0;
      local_78.m.ptr = (QAbstractItemModel *)0x0;
      (**(code **)(*(long *)pQVar19 + 0x68))(pQVar19,&local_78,2);
    }
  }
LAB_0053d102:
  QPersistentModelIndex::~QPersistentModelIndex(&local_58);
  if (*(QAbstractItemModel **)(in_FS_OFFSET + 0x28) == local_38.ptr) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemView::mousePressEvent(QMouseEvent *event)
{
    Q_D(QAbstractItemView);
    d->releaseFromDoubleClick = false;
    d->delayedAutoScroll.stop(); //any interaction with the view cancel the auto scrolling
    QPoint pos = event->position().toPoint();
    QPersistentModelIndex index = indexAt(pos);

    // this is the mouse press event that closed the last editor (via focus event)
    d->pressClosedEditor = d->pressClosedEditorWatcher.isActive() && d->lastEditedIndex == index;

    if (!d->selectionModel || (d->state == EditingState && d->hasEditor(index)))
        return;

    d->pressedAlreadySelected = d->selectionModel->isSelected(index);
    d->pressedIndex = index;
    d->pressedModifiers = event->modifiers();
    QItemSelectionModel::SelectionFlags command = selectionCommand(index, event);
    d->noSelectionOnMousePress = command == QItemSelectionModel::NoUpdate || !index.isValid();
    QPoint offset = d->offset();
    d->draggedPosition = pos + offset;

#if QT_CONFIG(draganddrop)
    // update the pressed position when drag was enable
    if (d->dragEnabled)
        d->pressedPosition = d->draggedPosition;
#endif

    if (!(command & QItemSelectionModel::Current)) {
        d->pressedPosition = pos + offset;
        d->currentSelectionStartIndex = index;
    }
    else if (!d->currentSelectionStartIndex.isValid())
        d->currentSelectionStartIndex = currentIndex();

    if (edit(index, NoEditTriggers, event))
        return;

    if (index.isValid() && d->isIndexEnabled(index)) {
        // we disable scrollTo for mouse press so the item doesn't change position
        // when the user is interacting with it (ie. clicking on it)
        bool autoScroll = d->autoScroll;
        d->autoScroll = false;
        d->selectionModel->setCurrentIndex(index, QItemSelectionModel::NoUpdate);
        d->autoScroll = autoScroll;
        if (command.testFlag(QItemSelectionModel::Toggle)) {
            command &= ~QItemSelectionModel::Toggle;
            d->ctrlDragSelectionFlag = d->selectionModel->isSelected(index) ? QItemSelectionModel::Deselect : QItemSelectionModel::Select;
            command |= d->ctrlDragSelectionFlag;
        }

        if (!(command & QItemSelectionModel::Current)) {
            setSelection(QRect(pos, QSize(1, 1)), command);
        } else {
            QRect rect(visualRect(d->currentSelectionStartIndex).center(), pos);
            setSelection(rect, command);
        }

        // signal handlers may change the model
        emit pressed(index);
        if (d->autoScroll) {
            //we delay the autoscrolling to filter out double click event
            //100 is to be sure that there won't be a double-click misinterpreted as a 2 single clicks
            d->delayedAutoScroll.start(QApplication::doubleClickInterval()+100, this);
        }

    } else {
        // Forces a finalize() even if mouse is pressed, but not on a item
        d->selectionModel->select(QModelIndex(), QItemSelectionModel::Select);
    }
}